

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAdES.h
# Opt level: O1

size_t __thiscall RDNSequence::SetDataSize(RDNSequence *this)

{
  pointer pRVar1;
  ulong uVar2;
  long lVar3;
  size_t sVar4;
  size_t *psVar5;
  long lVar6;
  
  pRVar1 = (this->name).
           super__Vector_base<RelativeDistinguishedName,_std::allocator<RelativeDistinguishedName>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(this->name).
                super__Vector_base<RelativeDistinguishedName,_std::allocator<RelativeDistinguishedName>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar1;
  if (lVar3 == 0) {
    sVar4 = 0;
  }
  else {
    lVar3 = (lVar3 >> 3) * -0x3333333333333333;
    lVar3 = lVar3 + (ulong)(lVar3 == 0);
    psVar5 = &(pRVar1->super_DerBase).cbData;
    sVar4 = 0;
    do {
      uVar2 = *psVar5;
      lVar6 = 2;
      if ((((0x7f < uVar2) && (lVar6 = 3, 0xff < uVar2)) && (lVar6 = 4, 0xffff < uVar2)) &&
         (((lVar6 = 5, 0xffffff < uVar2 && (lVar6 = 6, uVar2 >> 0x20 != 0)) &&
          (lVar6 = 7, uVar2 >> 0x28 != 0)))) {
        lVar6 = (ulong)(uVar2 >> 0x30 == 0) << 3;
      }
      sVar4 = sVar4 + uVar2 + lVar6;
      psVar5 = psVar5 + 5;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  (this->super_DerBase).cbData = sVar4;
  return sVar4;
}

Assistant:

virtual size_t SetDataSize() override
	{
        size_t cbNeeded = 0; 

        // First, calculate how much is needed for the set of names
        for (size_t i = 0; i < name.size(); ++i)
        {
            size_t cbName = name[i].EncodedSize();
            cbNeeded += cbName;
        }

        return (cbData = cbNeeded);
    }